

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlBufGetEntityRefContent(xmlBufPtr buf,xmlNode *ref)

{
  xmlEntityPtr local_20;
  xmlEntityPtr ent;
  xmlNode *ref_local;
  xmlBufPtr buf_local;
  
  if (ref->children == (_xmlNode *)0x0) {
    local_20 = xmlGetDocEntity(ref->doc,ref->name);
    if (local_20 == (xmlEntityPtr)0x0) {
      return;
    }
  }
  else {
    local_20 = (xmlEntityPtr)ref->children;
  }
  if (local_20->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
    xmlBufCat(buf,local_20->content);
  }
  else if ((local_20->flags & 8U) == 0) {
    local_20->flags = local_20->flags | 8;
    xmlBufGetChildContent(buf,(xmlNode *)local_20);
    local_20->flags = local_20->flags & 0xfffffff7;
  }
  return;
}

Assistant:

static void
xmlBufGetEntityRefContent(xmlBufPtr buf, const xmlNode *ref) {
    xmlEntityPtr ent;

    if (ref->children != NULL) {
        ent = (xmlEntityPtr) ref->children;
    } else {
        /* lookup entity declaration */
        ent = xmlGetDocEntity(ref->doc, ref->name);
        if (ent == NULL)
            return;
    }

    /*
     * The parser should always expand predefined entities but it's
     * possible to create references to predefined entities using
     * the tree API.
     */
    if (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
        xmlBufCat(buf, ent->content);
        return;
    }

    if (ent->flags & XML_ENT_EXPANDING)
        return;

    ent->flags |= XML_ENT_EXPANDING;
    xmlBufGetChildContent(buf, (xmlNodePtr) ent);
    ent->flags &= ~XML_ENT_EXPANDING;
}